

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_test.c
# Opt level: O0

int main(int argc,char **argv)

{
  MpiEncTestArgs *cmd_00;
  MpiEncTestArgs *cmd;
  RK_S32 ret;
  char **argv_local;
  int argc_local;
  
  cmd_00 = mpi_enc_test_cmd_get();
  cmd._4_4_ = mpi_enc_test_cmd_update_by_args(cmd_00,argc,argv);
  if (cmd._4_4_ == MPP_OK) {
    mpi_enc_test_cmd_show_opt(cmd_00);
    cmd._4_4_ = enc_test_multi(cmd_00,*argv);
  }
  mpi_enc_test_cmd_put(cmd_00);
  return cmd._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    RK_S32 ret = MPP_NOK;
    MpiEncTestArgs* cmd = mpi_enc_test_cmd_get();

    // parse the cmd option
    ret = mpi_enc_test_cmd_update_by_args(cmd, argc, argv);
    if (ret)
        goto DONE;

    mpi_enc_test_cmd_show_opt(cmd);

    ret = enc_test_multi(cmd, argv[0]);

DONE:
    mpi_enc_test_cmd_put(cmd);

    return ret;
}